

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

string * checkChi(string *__return_storage_ptr__,string *newCard)

{
  int iVar1;
  char *pcVar2;
  mapped_type *pmVar3;
  allocator local_3c1;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  mapped_type local_40;
  mapped_type local_3c;
  int flag2;
  int flag1;
  int flag0;
  int flag_2;
  int flag_1;
  allocator local_19;
  string *local_18;
  string *newCard_local;
  
  local_18 = newCard;
  newCard_local = __return_storage_ptr__;
  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)newCard);
  if ((*pcVar2 == 'F') ||
     (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)newCard), *pcVar2 == 'J')) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"Fail",&local_19);
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
    return __return_storage_ptr__;
  }
  flag0 = 0;
  flag1 = 0;
  flag2 = 0;
  local_3c = 0;
  local_40 = 0;
  std::__cxx11::string::string((string *)&local_a0,(string *)newCard);
  previousCard(&local_80,&local_a0);
  previousCard(&local_60,&local_80);
  pmVar3 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&my_active_card_abi_cxx11_,&local_60);
  iVar1 = *pmVar3;
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  if (iVar1 != 0) {
    std::__cxx11::string::string((string *)&local_100,(string *)newCard);
    previousCard(&local_e0,&local_100);
    previousCard(&local_c0,&local_e0);
    pmVar3 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&my_active_card_abi_cxx11_,&local_c0);
    flag1 = *pmVar3;
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_100);
  }
  std::__cxx11::string::string((string *)&local_140,(string *)newCard);
  previousCard(&local_120,&local_140);
  pmVar3 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&my_active_card_abi_cxx11_,&local_120);
  iVar1 = *pmVar3;
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_140);
  if (iVar1 != 0) {
    std::__cxx11::string::string((string *)&local_180,(string *)newCard);
    previousCard(&local_160,&local_180);
    pmVar3 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&my_active_card_abi_cxx11_,&local_160);
    flag0 = *pmVar3;
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&local_180);
  }
  flag2 = 1;
  std::__cxx11::string::string((string *)&local_1e0,(string *)newCard);
  postCard(&local_1c0,&local_1e0);
  postCard(&local_1a0,&local_1c0);
  pmVar3 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&my_active_card_abi_cxx11_,&local_1a0);
  iVar1 = *pmVar3;
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1e0);
  if (iVar1 != 0) {
    std::__cxx11::string::string((string *)&local_240,(string *)newCard);
    postCard(&local_220,&local_240);
    postCard(&local_200,&local_220);
    pmVar3 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&my_active_card_abi_cxx11_,&local_200);
    local_40 = *pmVar3;
    std::__cxx11::string::~string((string *)&local_200);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&local_240);
  }
  std::__cxx11::string::string((string *)&local_280,(string *)newCard);
  postCard(&local_260,&local_280);
  pmVar3 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&my_active_card_abi_cxx11_,&local_260);
  iVar1 = *pmVar3;
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_280);
  if (iVar1 != 0) {
    std::__cxx11::string::string((string *)&local_2c0,(string *)newCard);
    postCard(&local_2a0,&local_2c0);
    pmVar3 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&my_active_card_abi_cxx11_,&local_2a0);
    local_3c = *pmVar3;
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_2c0);
  }
  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)newCard);
  if (*pcVar2 + -0x30 < 6) {
    if ((flag0 == 1) && (flag1 == 1)) {
      std::__cxx11::string::string((string *)&local_320,(string *)newCard);
      previousCard(__return_storage_ptr__,&local_320);
      std::__cxx11::string::~string((string *)&local_320);
      return __return_storage_ptr__;
    }
    if ((flag0 == 1) && (local_3c == 1)) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)newCard);
      return __return_storage_ptr__;
    }
    if ((local_3c == 1) && (local_40 == 1)) {
      std::__cxx11::string::string((string *)&local_340,(string *)newCard);
      postCard(__return_storage_ptr__,&local_340);
      std::__cxx11::string::~string((string *)&local_340);
      return __return_storage_ptr__;
    }
  }
  else {
    if ((local_3c == 1) && (local_40 == 1)) {
      std::__cxx11::string::string((string *)&local_2e0,(string *)newCard);
      postCard(__return_storage_ptr__,&local_2e0);
      std::__cxx11::string::~string((string *)&local_2e0);
      return __return_storage_ptr__;
    }
    if ((flag0 == 1) && (local_3c == 1)) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)newCard);
      return __return_storage_ptr__;
    }
    if ((flag0 == 1) && (flag1 == 1)) {
      std::__cxx11::string::string((string *)&local_300,(string *)newCard);
      previousCard(__return_storage_ptr__,&local_300);
      std::__cxx11::string::~string((string *)&local_300);
      return __return_storage_ptr__;
    }
  }
  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)newCard);
  if (*pcVar2 + -0x30 < 6) {
    if ((flag0 == 2) && (flag1 == 2)) {
      std::__cxx11::string::string((string *)&local_3a0,(string *)newCard);
      previousCard(__return_storage_ptr__,&local_3a0);
      std::__cxx11::string::~string((string *)&local_3a0);
      return __return_storage_ptr__;
    }
    if ((flag0 == 2) && (local_3c == 2)) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)newCard);
      return __return_storage_ptr__;
    }
    if ((local_3c == 2) && (local_40 == 2)) {
      std::__cxx11::string::string((string *)&local_3c0,(string *)newCard);
      postCard(__return_storage_ptr__,&local_3c0);
      std::__cxx11::string::~string((string *)&local_3c0);
      return __return_storage_ptr__;
    }
  }
  else {
    if ((local_3c == 2) && (local_40 == 2)) {
      std::__cxx11::string::string((string *)&local_360,(string *)newCard);
      postCard(__return_storage_ptr__,&local_360);
      std::__cxx11::string::~string((string *)&local_360);
      return __return_storage_ptr__;
    }
    if ((flag0 == 2) && (local_3c == 2)) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)newCard);
      return __return_storage_ptr__;
    }
    if ((flag0 == 2) && (flag1 == 2)) {
      std::__cxx11::string::string((string *)&local_380,(string *)newCard);
      previousCard(__return_storage_ptr__,&local_380);
      std::__cxx11::string::~string((string *)&local_380);
      return __return_storage_ptr__;
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,"Fail",&local_3c1);
  std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
  return __return_storage_ptr__;
}

Assistant:

string checkChi(string newCard) {
    //return "Fail";
    if (newCard[0] == 'F' || newCard[0] == 'J')
        return "Fail";
    int flag_1 = 0, flag_2 = 0, flag0 = 0, flag1 = 0, flag2 = 0;
    if (my_active_card[previousCard(previousCard(newCard))]) {
        flag_2 = my_active_card[previousCard(previousCard(newCard))];
    }
    if (my_active_card[previousCard(newCard)]) {
        flag_1 = my_active_card[previousCard(newCard)];
    }
    flag0 = 1;
    if (my_active_card[postCard(postCard(newCard))]) {
        flag2 = my_active_card[postCard(postCard(newCard))];
    }
    if (my_active_card[postCard(newCard)]) {
        flag1 = my_active_card[postCard(newCard)];
    }
    if (newCard[1] - '0' > 5) {
        if (flag1 == 1 && flag2 == 1) {
            return postCard(newCard);
        }
        if (flag_1 == 1 && flag1 == 1) {
            return newCard;
        }
        if (flag_1 == 1 && flag_2 == 1) {
            return previousCard(newCard);
        }
    }
    else {
        if (flag_1 == 1 && flag_2 == 1) {
            return previousCard(newCard);
        }
        if (flag_1 == 1 && flag1 == 1) {
            return newCard;
        }
        if (flag1 == 1 && flag2 == 1) {
            return postCard(newCard);
        }
    }
    if (newCard[1] - '0' > 5) {
        if (flag1 == 2 && flag2 == 2) {
            return postCard(newCard);
        }
        if (flag_1 == 2 && flag1 == 2) {
            return newCard;
        }
        if (flag_1 == 2 && flag_2 == 2) {
            return previousCard(newCard);
        }
    }
    else {
        if (flag_1 == 2 && flag_2 == 2) {
            return previousCard(newCard);
        }
        if (flag_1 == 2 && flag1 == 2) {
            return newCard;
        }
        if (flag1 == 2 && flag2 == 2) {
            return postCard(newCard);
        }
    }
    return "Fail";
    /*
    vector<string> card;
    card = all_card[my_player_id];
    card.push_back(newCard);
    sort(card.begin(), card.end());
    vector<string>::iterator itr;
    vector<string>::iterator tmptr;
    itr = find(card.begin(), card.end(), newCard);
    string str_1 = "N";
    string str_2 = "N";
    string str1 = "N";
    string str2 = "N";
    string str0 = *(itr);
    tmptr = itr;
    while (itr != card.begin() && !strcmp(tmptr->c_str(), itr->c_str()) {
        tmptr = itr - 1;
    }
    str_1 = *tmptr;
    tmptr = itr;
    while (itr != card.begin() && itr - 1 != card.begin() && !strcmp(tmptr->c_str(), itr->c_str()) {
        tmptr = itr - 1;
    }
    str_1 = *tmptr;
    if (itr - 1 != card.begin()) { str_2 = *(itr - 2); }
    //itr++; itr++;

    if (itr + 1 != card.end()) str1 = *(itr + 1);
    //itr++; itr++;
    if (itr + 2 < card.end()) str2 = *(itr + 2);

    if (str_1[0] == newCard[0] && str_2[0] == newCard[0]) {
        if (str_1.length() > 1 && str_2.length() > 1 && newCard[1] - str_1[1] == 1 && str_1[1] - str_2[1] == 1) {
            return str_1;
        }
    }
    if (str1[0] == newCard[0] && str2[0] == newCard[0]) {
        if (str1.length() > 1 && str2.length() > 1 && newCard[1] - str1[1] == -1 && str1[1] - str2[1] == -1) {
            return str1;
        }
    }
    if (str_1[0] == newCard[0] && str1[0] == newCard[0]) {
        if (str_1.length() > 1 && str1.length() > 1 && newCard[1] - str_1[1] == 1 && str1[1] - newCard[1] == 1) {
            return newCard;
        }
    }
    */

}